

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O2

LogicalIndex __thiscall
duckdb::TableCatalogEntry::GetColumnIndex
          (TableCatalogEntry *this,string *column_name,bool if_exists)

{
  LogicalIndex LVar1;
  BinderException *this_00;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  LVar1 = ColumnList::GetColumnIndex(&this->columns,column_name);
  if (LVar1.index != 0xffffffffffffffff || if_exists) {
    return (LogicalIndex)LVar1.index;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Table \"%s\" does not have a column with name \"%s\"",&local_81);
  ::std::__cxx11::string::string
            ((string *)&local_60,
             (string *)&(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  ::std::__cxx11::string::string((string *)&local_80,(string *)column_name);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_40,&local_60,&local_80);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

LogicalIndex TableCatalogEntry::GetColumnIndex(string &column_name, bool if_exists) const {
	auto entry = columns.GetColumnIndex(column_name);
	if (!entry.IsValid()) {
		if (if_exists) {
			return entry;
		}
		throw BinderException("Table \"%s\" does not have a column with name \"%s\"", name, column_name);
	}
	return entry;
}